

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

bool GetXrParent(XrObjectType inhandle_type,uint64_t inhandle,XrObjectType *outhandle_type,
                uint64_t *outhandle)

{
  bool bVar1;
  GenValidUsageXrHandleInfo *pGVar2;
  
  bVar1 = false;
  if ((int)inhandle_type < 0x3b9ce8f8) {
    if ((int)inhandle_type < 0x3b9bf2e0) {
      if ((int)inhandle_type < 0x3b9b1438) {
        switch(inhandle_type) {
        case XR_OBJECT_TYPE_SESSION:
          pGVar2 = HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_session_info.
                               super_HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>,
                              (XrSession_T *)inhandle);
          break;
        case XR_OBJECT_TYPE_SWAPCHAIN:
          pGVar2 = HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_swapchain_info.
                               super_HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>,
                              (XrSwapchain_T *)inhandle);
          break;
        case XR_OBJECT_TYPE_SPACE:
          pGVar2 = HandleInfoBase<XrSpace_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_space_info.
                               super_HandleInfoBase<XrSpace_T_*,_GenValidUsageXrHandleInfo>,
                              (XrSpace_T *)inhandle);
          break;
        case XR_OBJECT_TYPE_ACTION_SET:
          pGVar2 = HandleInfoBase<XrActionSet_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_actionset_info.
                               super_HandleInfoBase<XrActionSet_T_*,_GenValidUsageXrHandleInfo>,
                              (XrActionSet_T *)inhandle);
          break;
        case XR_OBJECT_TYPE_ACTION:
          pGVar2 = HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_action_info.
                               super_HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>,
                              (XrAction_T *)inhandle);
          break;
        default:
          goto switchD_0014e15c_default;
        }
      }
      else if ((int)inhandle_type < 0x3b9b8968) {
        if (inhandle_type == XR_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
          pGVar2 = HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_debugutilsmessengerext_info.
                               super_HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>
                              ,(XrDebugUtilsMessengerEXT_T *)inhandle);
        }
        else {
          if (inhandle_type != XR_OBJECT_TYPE_SPATIAL_ANCHOR_MSFT) {
            return false;
          }
          pGVar2 = HandleInfoBase<XrSpatialAnchorMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_spatialanchormsft_info.
                               super_HandleInfoBase<XrSpatialAnchorMSFT_T_*,_GenValidUsageXrHandleInfo>
                              ,(XrSpatialAnchorMSFT_T *)inhandle);
        }
      }
      else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_GRAPH_NODE_BINDING_MSFT) {
        pGVar2 = HandleInfoBase<XrSpatialGraphNodeBindingMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_spatialgraphnodebindingmsft_info.
                             super_HandleInfoBase<XrSpatialGraphNodeBindingMSFT_T_*,_GenValidUsageXrHandleInfo>
                            ,(XrSpatialGraphNodeBindingMSFT_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_HAND_TRACKER_EXT) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_handtrackerext_info.
                             super_HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>,
                            (XrHandTrackerEXT_T *)inhandle);
      }
    }
    else if ((int)inhandle_type < 0x3b9c9308) {
      if ((int)inhandle_type < 0x3b9c44e9) {
        if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_FB) {
          pGVar2 = HandleInfoBase<XrBodyTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_bodytrackerfb_info.
                               super_HandleInfoBase<XrBodyTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                              (XrBodyTrackerFB_T *)inhandle);
        }
        else {
          if (inhandle_type != XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT) {
            return false;
          }
          pGVar2 = HandleInfoBase<XrSceneObserverMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_sceneobservermsft_info.
                               super_HandleInfoBase<XrSceneObserverMSFT_T_*,_GenValidUsageXrHandleInfo>
                              ,(XrSceneObserverMSFT_T *)inhandle);
        }
      }
      else if (inhandle_type == XR_OBJECT_TYPE_SCENE_MSFT) {
        pGVar2 = HandleInfoBase<XrSceneMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_scenemsft_info.
                             super_HandleInfoBase<XrSceneMSFT_T_*,_GenValidUsageXrHandleInfo>,
                            (XrSceneMSFT_T *)inhandle);
      }
      else if (inhandle_type == XR_OBJECT_TYPE_FACIAL_TRACKER_HTC) {
        pGVar2 = HandleInfoBase<XrFacialTrackerHTC_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_facialtrackerhtc_info.
                             super_HandleInfoBase<XrFacialTrackerHTC_T_*,_GenValidUsageXrHandleInfo>
                            ,(XrFacialTrackerHTC_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_FOVEATION_PROFILE_FB) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_foveationprofilefb_info.
                             super_HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>
                            ,(XrFoveationProfileFB_T *)inhandle);
      }
    }
    else if ((int)inhandle_type < 0x3b9c96f2) {
      if (inhandle_type == XR_OBJECT_TYPE_TRIANGLE_MESH_FB) {
        pGVar2 = HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_trianglemeshfb_info.
                             super_HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>,
                            (XrTriangleMeshFB_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_PASSTHROUGH_FB) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrPassthroughFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_passthroughfb_info.
                             super_HandleInfoBase<XrPassthroughFB_T_*,_GenValidUsageXrHandleInfo>,
                            (XrPassthroughFB_T *)inhandle);
      }
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_LAYER_FB) {
      pGVar2 = HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughlayerfb_info.
                           super_HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrPassthroughLayerFB_T *)inhandle);
    }
    else if (inhandle_type == XR_OBJECT_TYPE_GEOMETRY_INSTANCE_FB) {
      pGVar2 = HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_geometryinstancefb_info.
                           super_HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrGeometryInstanceFB_T *)inhandle);
    }
    else {
      if (inhandle_type != XR_OBJECT_TYPE_MARKER_DETECTOR_ML) {
        return false;
      }
      pGVar2 = HandleInfoBase<XrMarkerDetectorML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_markerdetectorml_info.
                           super_HandleInfoBase<XrMarkerDetectorML_T_*,_GenValidUsageXrHandleInfo>,
                          (XrMarkerDetectorML_T *)inhandle);
    }
  }
  else if ((int)inhandle_type < 0x3b9f3ab9) {
    if ((int)inhandle_type < 0x3b9e2178) {
      if ((int)inhandle_type < 0x3b9cf4b0) {
        if (inhandle_type == XR_OBJECT_TYPE_EXPORTED_LOCALIZATION_MAP_ML) {
          pGVar2 = HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_exportedlocalizationmapml_info.
                               super_HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>
                              ,(XrExportedLocalizationMapML_T *)inhandle);
        }
        else {
          if (inhandle_type != XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML) {
            return false;
          }
          pGVar2 = HandleInfoBase<XrSpatialAnchorsStorageML_T_*,_GenValidUsageXrHandleInfo>::get
                             (&g_spatialanchorsstorageml_info.
                               super_HandleInfoBase<XrSpatialAnchorsStorageML_T_*,_GenValidUsageXrHandleInfo>
                              ,(XrSpatialAnchorsStorageML_T *)inhandle);
        }
      }
      else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_STORE_CONNECTION_MSFT) {
        pGVar2 = HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>::
                 get(&g_spatialanchorstoreconnectionmsft_info.
                      super_HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>
                     ,(XrSpatialAnchorStoreConnectionMSFT_T *)inhandle);
      }
      else if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER_FB) {
        pGVar2 = HandleInfoBase<XrFaceTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_facetrackerfb_info.
                             super_HandleInfoBase<XrFaceTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                            (XrFaceTrackerFB_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_EYE_TRACKER_FB) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_eyetrackerfb_info.
                             super_HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                            (XrEyeTrackerFB_T *)inhandle);
      }
    }
    else if ((int)inhandle_type < 0x3b9ed910) {
      if (inhandle_type == XR_OBJECT_TYPE_VIRTUAL_KEYBOARD_META) {
        pGVar2 = HandleInfoBase<XrVirtualKeyboardMETA_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_virtualkeyboardmeta_info.
                             super_HandleInfoBase<XrVirtualKeyboardMETA_T_*,_GenValidUsageXrHandleInfo>
                            ,(XrVirtualKeyboardMETA_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_SPACE_USER_FB) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_spaceuserfb_info.
                             super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>,
                            (XrSpaceUserFB_T *)inhandle);
      }
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_COLOR_LUT_META) {
      pGVar2 = HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughcolorlutmeta_info.
                           super_HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrPassthroughColorLutMETA_T *)inhandle);
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER2_FB) {
      pGVar2 = HandleInfoBase<XrFaceTracker2FB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_facetracker2fb_info.
                           super_HandleInfoBase<XrFaceTracker2FB_T_*,_GenValidUsageXrHandleInfo>,
                          (XrFaceTracker2FB_T *)inhandle);
    }
    else {
      if (inhandle_type != XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_PROVIDER_META) {
        return false;
      }
      pGVar2 = HandleInfoBase<XrEnvironmentDepthProviderMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_environmentdepthprovidermeta_info.
                           super_HandleInfoBase<XrEnvironmentDepthProviderMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrEnvironmentDepthProviderMETA_T *)inhandle);
    }
  }
  else if ((int)inhandle_type < 0x3ba0b989) {
    if ((int)inhandle_type < 0x3b9fac00) {
      if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META) {
        pGVar2 = HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_environmentdepthswapchainmeta_info.
                             super_HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>
                            ,(XrEnvironmentDepthSwapchainMETA_T *)inhandle);
      }
      else {
        if (inhandle_type != XR_OBJECT_TYPE_PASSTHROUGH_HTC) {
          return false;
        }
        pGVar2 = HandleInfoBase<XrPassthroughHTC_T_*,_GenValidUsageXrHandleInfo>::get
                           (&g_passthroughhtc_info.
                             super_HandleInfoBase<XrPassthroughHTC_T_*,_GenValidUsageXrHandleInfo>,
                            (XrPassthroughHTC_T *)inhandle);
      }
    }
    else if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_HTC) {
      pGVar2 = HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_bodytrackerhtc_info.
                           super_HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>,
                          (XrBodyTrackerHTC_T *)inhandle);
    }
    else if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_BD) {
      pGVar2 = HandleInfoBase<XrBodyTrackerBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_bodytrackerbd_info.
                           super_HandleInfoBase<XrBodyTrackerBD_T_*,_GenValidUsageXrHandleInfo>,
                          (XrBodyTrackerBD_T *)inhandle);
    }
    else {
      if (inhandle_type != XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD) {
        return false;
      }
      pGVar2 = HandleInfoBase<XrSenseDataProviderBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_sensedataproviderbd_info.
                           super_HandleInfoBase<XrSenseDataProviderBD_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrSenseDataProviderBD_T *)inhandle);
    }
  }
  else if ((int)inhandle_type < 0x3ba155c8) {
    if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD) {
      pGVar2 = HandleInfoBase<XrSenseDataSnapshotBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_sensedatasnapshotbd_info.
                           super_HandleInfoBase<XrSenseDataSnapshotBD_T_*,_GenValidUsageXrHandleInfo>
                          ,(XrSenseDataSnapshotBD_T *)inhandle);
    }
    else {
      if (inhandle_type != XR_OBJECT_TYPE_ANCHOR_BD) {
        return false;
      }
      pGVar2 = HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_anchorbd_info.
                           super_HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>,
                          (XrAnchorBD_T *)inhandle);
    }
  }
  else if (inhandle_type == XR_OBJECT_TYPE_PLANE_DETECTOR_EXT) {
    pGVar2 = HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>::get
                       (&g_planedetectorext_info.
                         super_HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>,
                        (XrPlaneDetectorEXT_T *)inhandle);
  }
  else if (inhandle_type == XR_OBJECT_TYPE_WORLD_MESH_DETECTOR_ML) {
    pGVar2 = HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>::get
                       (&g_worldmeshdetectorml_info.
                         super_HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>,
                        (XrWorldMeshDetectorML_T *)inhandle);
  }
  else {
    if (inhandle_type != XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML) {
      return false;
    }
    pGVar2 = HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>::get
                       (&g_facialexpressionclientml_info.
                         super_HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>
                        ,(XrFacialExpressionClientML_T *)inhandle);
  }
  *outhandle_type = pGVar2->direct_parent_type;
  *outhandle = pGVar2->direct_parent_handle;
  bVar1 = true;
switchD_0014e15c_default:
  return bVar1;
}

Assistant:

bool GetXrParent(const XrObjectType inhandle_type, const uint64_t inhandle,
                 XrObjectType& outhandle_type, uint64_t& outhandle) {
    if (inhandle_type == XR_OBJECT_TYPE_INSTANCE) {
        return false;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SESSION) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_session_info.get(TreatIntegerAsHandle<XrSession>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPACE) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_space_info.get(TreatIntegerAsHandle<XrSpace>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ACTION) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_action_info.get(TreatIntegerAsHandle<XrAction>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SWAPCHAIN) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_swapchain_info.get(TreatIntegerAsHandle<XrSwapchain>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ACTION_SET) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_actionset_info.get(TreatIntegerAsHandle<XrActionSet>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_debugutilsmessengerext_info.get(TreatIntegerAsHandle<XrDebugUtilsMessengerEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchormsft_info.get(TreatIntegerAsHandle<XrSpatialAnchorMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_GRAPH_NODE_BINDING_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialgraphnodebindingmsft_info.get(TreatIntegerAsHandle<XrSpatialGraphNodeBindingMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_HAND_TRACKER_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_handtrackerext_info.get(TreatIntegerAsHandle<XrHandTrackerEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerfb_info.get(TreatIntegerAsHandle<XrBodyTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sceneobservermsft_info.get(TreatIntegerAsHandle<XrSceneObserverMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SCENE_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_scenemsft_info.get(TreatIntegerAsHandle<XrSceneMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACIAL_TRACKER_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facialtrackerhtc_info.get(TreatIntegerAsHandle<XrFacialTrackerHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FOVEATION_PROFILE_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_foveationprofilefb_info.get(TreatIntegerAsHandle<XrFoveationProfileFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_TRIANGLE_MESH_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_trianglemeshfb_info.get(TreatIntegerAsHandle<XrTriangleMeshFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughfb_info.get(TreatIntegerAsHandle<XrPassthroughFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_LAYER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughlayerfb_info.get(TreatIntegerAsHandle<XrPassthroughLayerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_GEOMETRY_INSTANCE_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_geometryinstancefb_info.get(TreatIntegerAsHandle<XrGeometryInstanceFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_MARKER_DETECTOR_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_markerdetectorml_info.get(TreatIntegerAsHandle<XrMarkerDetectorML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_EXPORTED_LOCALIZATION_MAP_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_exportedlocalizationmapml_info.get(TreatIntegerAsHandle<XrExportedLocalizationMapML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchorsstorageml_info.get(TreatIntegerAsHandle<XrSpatialAnchorsStorageML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_STORE_CONNECTION_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchorstoreconnectionmsft_info.get(TreatIntegerAsHandle<XrSpatialAnchorStoreConnectionMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPACE_USER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spaceuserfb_info.get(TreatIntegerAsHandle<XrSpaceUserFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facetrackerfb_info.get(TreatIntegerAsHandle<XrFaceTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_EYE_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_eyetrackerfb_info.get(TreatIntegerAsHandle<XrEyeTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_VIRTUAL_KEYBOARD_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_virtualkeyboardmeta_info.get(TreatIntegerAsHandle<XrVirtualKeyboardMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_COLOR_LUT_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughcolorlutmeta_info.get(TreatIntegerAsHandle<XrPassthroughColorLutMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER2_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facetracker2fb_info.get(TreatIntegerAsHandle<XrFaceTracker2FB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_PROVIDER_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_environmentdepthprovidermeta_info.get(TreatIntegerAsHandle<XrEnvironmentDepthProviderMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_environmentdepthswapchainmeta_info.get(TreatIntegerAsHandle<XrEnvironmentDepthSwapchainMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughhtc_info.get(TreatIntegerAsHandle<XrPassthroughHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerhtc_info.get(TreatIntegerAsHandle<XrBodyTrackerHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerbd_info.get(TreatIntegerAsHandle<XrBodyTrackerBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sensedataproviderbd_info.get(TreatIntegerAsHandle<XrSenseDataProviderBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sensedatasnapshotbd_info.get(TreatIntegerAsHandle<XrSenseDataSnapshotBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ANCHOR_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_anchorbd_info.get(TreatIntegerAsHandle<XrAnchorBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PLANE_DETECTOR_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_planedetectorext_info.get(TreatIntegerAsHandle<XrPlaneDetectorEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_WORLD_MESH_DETECTOR_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_worldmeshdetectorml_info.get(TreatIntegerAsHandle<XrWorldMeshDetectorML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facialexpressionclientml_info.get(TreatIntegerAsHandle<XrFacialExpressionClientML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    return false;
}